

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgl.c
# Opt level: O1

GLuint SDL_GL_LoadTexture(SDL_Surface *surface,GLfloat *texcoord)

{
  Uint8 UVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  GLuint GVar9;
  GLuint texture;
  SDL_Rect area;
  
  iVar2 = surface->w;
  iVar3 = 1;
  do {
    iVar7 = iVar3;
    iVar3 = iVar7 * 2;
  } while (iVar7 < iVar2);
  iVar3 = surface->h;
  iVar5 = 1;
  do {
    iVar8 = iVar5;
    iVar5 = iVar8 * 2;
  } while (iVar8 < iVar3);
  texcoord[0] = 0.0;
  texcoord[1] = 0.0;
  texcoord[2] = (float)iVar2 / (float)iVar7;
  texcoord[3] = (float)iVar3 / (float)iVar8;
  lVar6 = SDL_CreateRGBSurface(0,iVar7,iVar8,0x20,0xff,0xff00,0xff0000,0xffffffffff000000);
  GVar9 = 0;
  if (lVar6 != 0) {
    uVar4 = surface->flags;
    UVar1 = surface->format->alpha;
    if ((uVar4 >> 0x10 & 1) != 0) {
      SDL_SetAlpha(surface,0,0);
    }
    area.x = 0;
    area.y = 0;
    area.w = (Uint16)surface->w;
    area.h = (Uint16)surface->h;
    SDL_UpperBlit(surface,&area,lVar6);
    if ((uVar4 >> 0x10 & 1) != 0) {
      SDL_SetAlpha(surface,uVar4 & 0x12000,UVar1);
    }
    glGenTextures(1,&texture);
    glBindTexture(0xde1,texture);
    glTexParameteri(0xde1,0x2800,0x2600);
    glTexParameteri(0xde1,0x2801,0x2600);
    glTexImage2D(0xde1,0,0x1908,iVar7,iVar8,0,0x1908,0x1401,*(undefined8 *)(lVar6 + 0x20));
    SDL_FreeSurface(lVar6);
    GVar9 = texture;
  }
  return GVar9;
}

Assistant:

GLuint SDL_GL_LoadTexture(SDL_Surface *surface, GLfloat *texcoord)
{
	GLuint texture;
	int w, h;
	SDL_Surface *image;
	SDL_Rect area;
	Uint32 saved_flags;
	Uint8  saved_alpha;

	/* Use the surface width and height expanded to powers of 2 */
	w = power_of_two(surface->w);
	h = power_of_two(surface->h);
	texcoord[0] = 0.0f;			/* Min X */
	texcoord[1] = 0.0f;			/* Min Y */
	texcoord[2] = (GLfloat)surface->w / w;	/* Max X */
	texcoord[3] = (GLfloat)surface->h / h;	/* Max Y */

	image = SDL_CreateRGBSurface(
			SDL_SWSURFACE,
			w, h,
			32,
#if SDL_BYTEORDER == SDL_LIL_ENDIAN /* OpenGL RGBA masks */
			0x000000FF, 
			0x0000FF00, 
			0x00FF0000, 
			0xFF000000
#else
			0xFF000000,
			0x00FF0000, 
			0x0000FF00, 
			0x000000FF
#endif
		       );
	if ( image == NULL ) {
		return 0;
	}

	/* Save the alpha blending attributes */
	saved_flags = surface->flags&(SDL_SRCALPHA|SDL_RLEACCELOK);
	saved_alpha = surface->format->alpha;
	if ( (saved_flags & SDL_SRCALPHA) == SDL_SRCALPHA ) {
		SDL_SetAlpha(surface, 0, 0);
	}

	/* Copy the surface into the GL texture image */
	area.x = 0;
	area.y = 0;
	area.w = surface->w;
	area.h = surface->h;
	SDL_BlitSurface(surface, &area, image, &area);

	/* Restore the alpha blending attributes */
	if ( (saved_flags & SDL_SRCALPHA) == SDL_SRCALPHA ) {
		SDL_SetAlpha(surface, saved_flags, saved_alpha);
	}

	/* Create an OpenGL texture for the image */
	glGenTextures(1, &texture);
	glBindTexture(GL_TEXTURE_2D, texture);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	glTexImage2D(GL_TEXTURE_2D,
		     0,
		     GL_RGBA,
		     w, h,
		     0,
		     GL_RGBA,
		     GL_UNSIGNED_BYTE,
		     image->pixels);
	SDL_FreeSurface(image); /* No longer needed */

	return texture;
}